

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

int __thiscall
axl::sl::StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::copy
          (StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  size_t length;
  C *pCVar1;
  
  if (src == (EVP_PKEY_CTX *)0xffffffffffffffff) {
    src = (EVP_PKEY_CTX *)StringDetailsBase<char>::calcLength((C *)dst);
  }
  if (src == (EVP_PKEY_CTX *)0x0) {
    clear(this);
    length = 0;
  }
  else {
    length = enc::
             Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::sl::Nop<wchar_t,_wchar_t>,_axl::enc::Utf8Decoder>
             ::calcRequiredLength((SrcUnit *)dst,(SrcUnit *)(src + (long)dst),0xfffd);
    pCVar1 = createBuffer(this,length,false);
    if (pCVar1 == (C *)0x0) {
      length = 0xffffffffffffffff;
    }
    else {
      enc::
      Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::sl::Nop<wchar_t,_wchar_t>,_axl::enc::Utf8Decoder>
      ::convert_u((this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p,
                  (SrcUnit *)dst,(SrcUnit *)(src + (long)dst),0xfffd);
    }
  }
  return (int)length;
}

Assistant:

size_t
	copy(
		const C2* p,
		size_t length = -1
	) {
		if (length == -1)
			length = Details2::calcLength(p);

		if (!length) {
			clear();
			return 0;
		}

		// TODO: remove pre-calculation of required length

		size_t newLength = enc::Convert<Encoding, Encoding2>::calcRequiredLength(p, p + length);
		if (!createBuffer(newLength, false))
			return -1;

		enc::Convert<Encoding, Encoding2>::convert_u(this->m_p, p, p + length);
		return newLength;
	}